

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O3

TA_RetCode
TA_STDDEV_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                 int *outNBElement)

{
  TA_RetCode TVar1;
  
  TVar1 = TA_STDDEV(startIdx,endIdx,(params->in->data).inReal,(params->optIn->data).optInInteger,
                    params->optIn[1].data.optInReal,outBegIdx,outNBElement,
                    (params->out->data).outReal);
  return TVar1;
}

Assistant:

TA_RetCode TA_STDDEV_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_STDDEV(
/* Generated */                startIdx,
/* Generated */                endIdx,
/* Generated */                params->in[0].data.inReal, /* inReal */
/* Generated */                params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                params->optIn[1].data.optInReal, /* optInNbDev*/
/* Generated */                outBegIdx, 
/* Generated */                outNBElement, 
/* Generated */                params->out[0].data.outReal /*  outReal */ );
/* Generated */ }